

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O1

void __thiscall helics::udp::UdpComms::closeReceiver(UdpComms *this)

{
  string *this_00;
  per_descriptor_data *ppdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  size_type sVar4;
  undefined8 uVar5;
  uint __val;
  undefined8 uVar6;
  void *size;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  void *data;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 addr;
  size_t addrlen;
  uint __len;
  string_view fmt;
  string_view message;
  format_args args;
  string local_1c8;
  string __str;
  shared_ptr<gmlc::networking::AsioContextManager> serv;
  endpoint rxEndpoint;
  error_code error;
  string cls;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  size_type sStack_f0;
  socket transmitter;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [5];
  
  if ((this->super_NetworkCommsInterface).super_CommsInterface.txStatus._M_i == CONNECTED) {
    ActionMessage::ActionMessage((ActionMessage *)&transmitter,cmd_protocol);
    transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_ =
         (service_type *)
         CONCAT44(0x16570bf,
                  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                  service_._0_4_);
    CommsInterface::transmit
              ((CommsInterface *)this,(route_id)0xffffffff,(ActionMessage *)&transmitter);
    ActionMessage::~ActionMessage((ActionMessage *)&transmitter);
    return;
  }
  if (((this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i & 1U) !=
      0) {
    return;
  }
  ppdVar1 = &transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
             implementation_.super_base_implementation_type.reactor_data_;
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.socket_ = 0;
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.state_ = '\0';
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type._5_3_ = 0;
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.reactor_data_._0_1_ = 0;
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_ =
       (service_type *)ppdVar1;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&serv,(string *)&transmitter);
  if (transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_ !=
      (service_type *)ppdVar1) {
    operator_delete(transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                    service_,CONCAT71(transmitter.
                                      super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_
                                      .implementation_.super_base_implementation_type.reactor_data_.
                                      _1_7_,transmitter.
                                            super_basic_socket<asio::ip::udp,_asio::any_io_executor>
                                            .impl_.implementation_.super_base_implementation_type.
                                            reactor_data_._0_1_) + 1);
  }
  if (serv.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) goto LAB_00259b2b;
  rxEndpoint.impl_.data_._8_4_ = 0;
  rxEndpoint.impl_.data_._12_4_ = 0;
  rxEndpoint.impl_.data_._16_4_ = 0;
  rxEndpoint.impl_.data_._20_4_ = 0;
  rxEndpoint.impl_.data_.v6.sin6_scope_id = 0;
  rxEndpoint.impl_.data_._0_8_ = 2;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress._M_string_length
      == 0) {
LAB_002597a3:
    asio::detail::
    io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>::
    io_object_impl<asio::io_context>
              ((io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
                *)&cls,0,0,
               ((serv.
                 super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->ictx)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
    local_f8._M_pi._0_4_ =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"127.0.0.1","");
    uVar3 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar11 = (ulong)__val;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar10 = (uint)uVar11;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_0025985a;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_0025985a;
        }
        if (uVar10 < 10000) goto LAB_0025985a;
        uVar11 = uVar11 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_0025985a:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__str,
                 (ulong)(__len + -((int)uVar3 >> 0x1f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p + (uint)-((int)uVar3 >> 0x1f),__len,__val);
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&transmitter,(protocol_type *)&local_f8,
               &local_1c8,&__str,address_configured);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&local_1c8,
               (basic_resolver<asio::ip::udp,_asio::any_io_executor> *)&cls,(query *)&transmitter);
    sVar4 = *(size_type *)local_1c8._M_dataplus._M_p;
    lVar9 = local_1c8.field_2._M_allocated_capacity * 0x60;
    rxEndpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(sVar4 + 0x18 + lVar9);
    uVar5 = *(undefined8 *)(sVar4 + 0x10 + lVar9);
    rxEndpoint.impl_.data_._0_8_ = *(undefined8 *)(sVar4 + lVar9);
    uVar6 = ((undefined8 *)(sVar4 + lVar9))[1];
    rxEndpoint.impl_.data_._8_4_ = (undefined4)uVar6;
    rxEndpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    rxEndpoint.impl_.data_._16_4_ = (undefined4)uVar5;
    rxEndpoint.impl_.data_._20_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
           super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
           .prop_fns_ != local_88) {
      operator_delete(transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                      executor_.
                      super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                      .prop_fns_,local_88[0]._M_allocated_capacity + 1);
    }
    if ((void **)transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                 executor_.
                 super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                 .super_any_executor_base.object_.data._16_8_ !=
        &transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
         super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
         .super_any_executor_base.target_) {
      operator_delete((void *)transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.
                              impl_.executor_.
                              super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                              .super_any_executor_base.object_.data._16_8_,
                      (long)transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.
                            impl_.executor_.
                            super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                            .super_any_executor_base.target_ + 1);
    }
  }
  else {
    this_00 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,"*"
                   );
    if ((iVar8 == 0) ||
       (iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00,"udp://*"), iVar8 == 0)) goto LAB_002597a3;
    asio::detail::
    io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>::
    io_object_impl<asio::io_context>
              ((io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
                *)&cls,0,0,
               ((serv.
                 super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->ictx)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
    __str._M_dataplus._M_p._0_4_ =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    std::__cxx11::to_string
              (&local_1c8,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&transmitter,(protocol_type *)&__str,this_00,
               &local_1c8,address_configured);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&local_1c8,
               (basic_resolver<asio::ip::udp,_asio::any_io_executor> *)&cls,(query *)&transmitter);
    sVar4 = *(size_type *)local_1c8._M_dataplus._M_p;
    lVar9 = local_1c8.field_2._M_allocated_capacity * 0x60;
    rxEndpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(sVar4 + 0x18 + lVar9);
    uVar5 = *(undefined8 *)(sVar4 + 0x10 + lVar9);
    rxEndpoint.impl_.data_._0_8_ = *(undefined8 *)(sVar4 + lVar9);
    uVar6 = ((undefined8 *)(sVar4 + lVar9))[1];
    rxEndpoint.impl_.data_._8_4_ = (undefined4)uVar6;
    rxEndpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    rxEndpoint.impl_.data_._16_4_ = (undefined4)uVar5;
    rxEndpoint.impl_.data_._20_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._M_string_length);
    }
    asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&transmitter);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
  ::~io_object_impl((io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
                     *)&cls);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) {
    cls._M_dataplus._M_p._0_2_ = 10;
  }
  else {
    cls._M_dataplus._M_p._0_2_ = 2;
  }
  cls.field_2._M_allocated_capacity._0_2_ = 0;
  cls._M_string_length._4_4_ = 0;
  cls._M_string_length._2_2_ = 0;
  cls._M_string_length._0_2_ = 0;
  cls._M_dataplus._M_p._2_6_ = 0;
  cls.field_2._8_4_ = 0;
  cls.field_2._M_allocated_capacity._4_4_ = 0;
  cls.field_2._M_allocated_capacity._2_2_ = 0;
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,
             ((serv.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,(endpoint_type *)&cls,0);
  paVar2 = &cls.field_2;
  cls._M_dataplus._M_p._0_2_ = SUB82(paVar2,0);
  cls._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar2 >> 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&cls,"close","");
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  size = (void *)CONCAT44(cls._M_string_length._4_4_,
                          CONCAT22(cls._M_string_length._2_2_,(undefined2)cls._M_string_length));
  data = size;
  if (size != (void *)0x0) {
    data = (void *)CONCAT62(cls._M_dataplus._M_p._2_6_,cls._M_dataplus._M_p._0_2_);
  }
  addr.values_ = (value<fmt::v11::context> *)&rxEndpoint;
  addrlen = 0x1c;
  if (rxEndpoint.impl_.data_.base.sa_family == 2) {
    addrlen = 0x10;
  }
  asio::detail::socket_ops::sync_sendto1
            (transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
             implementation_.super_base_implementation_type.socket_,
             transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
             implementation_.super_base_implementation_type.state_,data,(size_t)size,0,addr.values_,
             addrlen,&error);
  if (error._M_value != 0) {
    (**(code **)(*(long *)error._M_cat + 0x20))(&__str);
    local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_dataplus._M_p;
    sStack_f0 = __str._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x21;
    args.field_1.values_ = addr.values_;
    args.desc_ = (unsigned_long_long)&local_f8;
    ::fmt::v11::vformat_abi_cxx11_(&local_1c8,(v11 *)"transmit failure on disconnect:{}",fmt,args);
    message._M_str = local_1c8._M_dataplus._M_p;
    message._M_len = local_1c8._M_string_length;
    CommsInterface::logWarning((CommsInterface *)this,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(cls._M_dataplus._M_p._2_6_,cls._M_dataplus._M_p._0_2_) != paVar2) {
    operator_delete((undefined1 *)CONCAT62(cls._M_dataplus._M_p._2_6_,cls._M_dataplus._M_p._0_2_),
                    CONCAT44(cls.field_2._M_allocated_capacity._4_4_,
                             CONCAT22(cls.field_2._M_allocated_capacity._2_2_,
                                      cls.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                   *)&transmitter);
LAB_00259b2b:
  if (serv.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               serv.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void UdpComms::closeReceiver()
{
    if (getTxStatus() == ConnectionStatus::CONNECTED) {
        ActionMessage cmd(CMD_PROTOCOL);
        cmd.messageID = CLOSE_RECEIVER;
        transmit(control_route, cmd);
    } else if (!disconnecting) {
        try {
            auto serv = gmlc::networking::AsioContextManager::getContextPointer();
            if (serv) {
                udp::endpoint rxEndpoint;

                if (localTargetAddress.empty() || localTargetAddress == "*" ||
                    localTargetAddress == "udp://*") {
                    // try connecting with the receiver socket
                    udp::resolver resolver(serv->getBaseContext());
                    const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                                          "127.0.0.1",
                                                          std::to_string(PortNumber));
                    rxEndpoint = *resolver.resolve(queryLocal);
                } else {
                    // try connecting with the receiver socket
                    udp::resolver resolver(serv->getBaseContext());
                    const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                                          localTargetAddress,
                                                          std::to_string(PortNumber));
                    rxEndpoint = *resolver.resolve(queryLocal);
                }

                udp::socket transmitter(serv->getBaseContext(),
                                        udp::endpoint(udpnet(interfaceNetwork), 0));
                std::string cls("close");
                std::error_code error;
                transmitter.send_to(asio::buffer(cls), rxEndpoint, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure on disconnect:{}", error.message()));
                }
            }
        }
        // NOLINTNEXTLINE
        catch (...) {
            // ignore error here since we are already disconnecting
        }
    }
}